

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_GroupVarsInsert3(int Groups,int i)

{
  uint uVar1;
  
  if (i < -1) {
    __assert_fail("i+1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xb0,"int Gem_GroupVarsInsert3(int, int)");
  }
  if ((i != -1) && (((uint)Groups >> (i & 0x1fU) & 1) == 0)) {
    __assert_fail("i == -1 || (Groups >> i) & 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xb1,"int Gem_GroupVarsInsert3(int, int)");
  }
  uVar1 = 0;
  if (i + 1 != 0) {
    uVar1 = 0xffffffff >> (~(byte)i & 0x1f);
  }
  return 4 << ((byte)(i + 1) & 0x1f) | uVar1 & Groups | (~uVar1 & Groups) << 3;
}

Assistant:

int Gem_GroupVarsInsert3( int Groups, int i ) // insert group of 3 bits after i
{
    int Mask = i+1 ? Abc_InfoMask( i+1 ) : 0;
    assert( i+1 >= 0 );
    assert( i == -1 || (Groups >> i) & 1 );
    return (Groups & Mask) | ((Groups & ~Mask) << 3) | (0x4 << (i+1));
}